

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,CuePoint *cp,TrackPosition *tp)

{
  Cluster *this_00;
  bool bVar1;
  int iVar2;
  longlong lVar3;
  long lVar4;
  undefined4 extraout_var;
  Tracks *this_02;
  Track *this_03;
  longlong type;
  Track *pTrack;
  long tn;
  Tracks *pTracks;
  longlong tc_;
  Block *pBlock_1;
  BlockEntry *pEntry_1;
  long status_1;
  long len_1;
  longlong pos_1;
  long index;
  Block *pBlock;
  BlockEntry *pEntry;
  long status;
  long len;
  longlong pos;
  long index_1;
  long block;
  longlong tc;
  TrackPosition *tp_local;
  CuePoint *cp_local;
  Cluster *this_local;
  Block *this_01;
  
  tc = (longlong)tp;
  tp_local = (TrackPosition *)cp;
  cp_local = (CuePoint *)this;
  if (this->m_pSegment == (Segment *)0x0) {
    __assert_fail("m_pSegment",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1d50,
                  "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                 );
  }
  block = CuePoint::GetTimeCode(cp);
  if (*(long *)(tc + 0x10) < 1) {
LAB_00117ace:
    pos_1 = 0;
    while( true ) {
      while( true ) {
        if (this->m_entries_count <= pos_1) {
          lVar4 = Parse(this,&len_1,&status_1);
          if (lVar4 < 0) {
            return (BlockEntry *)0x0;
          }
          if (0 < lVar4) {
            return (BlockEntry *)0x0;
          }
          if (this->m_entries == (BlockEntry **)0x0) {
            __assert_fail("m_entries",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1d80,
                          "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                         );
          }
          if (this->m_entries_count <= pos_1) {
            __assert_fail("index < m_entries_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1d81,
                          "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                         );
          }
        }
        this_00 = (Cluster *)this->m_entries[pos_1];
        if (this_00 == (Cluster *)0x0) {
          __assert_fail("pEntry",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d85,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        bVar1 = BlockEntry::EOS((BlockEntry *)this_00);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!pEntry->EOS()",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d86,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        iVar2 = (*(code *)this_00->m_pSegment->m_start)();
        this_01 = (Block *)CONCAT44(extraout_var,iVar2);
        if (this_01 == (Block *)0x0) {
          __assert_fail("pBlock",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d89,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        lVar3 = Block::GetTrackNumber(this_01);
        if (lVar3 == *(long *)tc) break;
        pos_1 = pos_1 + 1;
      }
      lVar3 = Block::GetTimeCode(this_01,this);
      if (block <= lVar3) break;
      pos_1 = pos_1 + 1;
    }
    if (block < lVar3) {
      this_local = (Cluster *)0x0;
    }
    else {
      this_02 = Segment::GetTracks(this->m_pSegment);
      if (this_02 == (Tracks *)0x0) {
        __assert_fail("pTracks",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d9b,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                     );
      }
      this_03 = Tracks::GetTrackByNumber(this_02,*(long *)tc);
      if (this_03 == (Track *)0x0) {
        this_local = (Cluster *)0x0;
      }
      else {
        lVar4 = Track::GetType(this_03);
        this_local = this_00;
        if (lVar4 != 2) {
          if (lVar4 == 1) {
            bVar1 = Block::IsKey(this_01);
            if (!bVar1) {
              this_local = (Cluster *)0x0;
            }
          }
          else {
            this_local = (Cluster *)0x0;
          }
        }
      }
    }
  }
  else {
    index_1 = *(long *)(tc + 0x10);
    pos = index_1 + -1;
    do {
      if (pos < this->m_entries_count) {
        pBlock = (Block *)this->m_entries[pos];
        if (pBlock == (Block *)0x0) {
          __assert_fail("pEntry",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d65,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        bVar1 = BlockEntry::EOS((BlockEntry *)pBlock);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!pEntry->EOS()",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d66,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        index = (**(code **)(pBlock->m_start + 0x10))();
        if ((Block *)index == (Block *)0x0) {
          __assert_fail("pBlock",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d69,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        lVar3 = Block::GetTrackNumber((Block *)index);
        if ((lVar3 == *(long *)tc) &&
           (lVar3 = Block::GetTimeCode((Block *)index,this), lVar3 == block)) {
          return (BlockEntry *)pBlock;
        }
        goto LAB_00117ace;
      }
      pEntry = (BlockEntry *)Parse(this,&len,&status);
      if ((long)pEntry < 0) {
        return (BlockEntry *)0x0;
      }
    } while ((long)pEntry < 1);
    this_local = (Cluster *)0x0;
  }
  return (BlockEntry *)this_local;
}

Assistant:

const BlockEntry* Cluster::GetEntry(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) const {
  assert(m_pSegment);
  const long long tc = cp.GetTimeCode();

  if (tp.m_block > 0) {
    const long block = static_cast<long>(tp.m_block);
    const long index = block - 1;

    while (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if ((pBlock->GetTrackNumber() == tp.m_track) &&
        (pBlock->GetTimeCode(this) == tc)) {
      return pEntry;
    }
  }

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != tp.m_track) {
      ++index;
      continue;
    }

    const long long tc_ = pBlock->GetTimeCode(this);

    if (tc_ < tc) {
      ++index;
      continue;
    }

    if (tc_ > tc)
      return NULL;

    const Tracks* const pTracks = m_pSegment->GetTracks();
    assert(pTracks);

    const long tn = static_cast<long>(tp.m_track);
    const Track* const pTrack = pTracks->GetTrackByNumber(tn);

    if (pTrack == NULL)
      return NULL;

    const long long type = pTrack->GetType();

    if (type == 2)  // audio
      return pEntry;

    if (type != 1)  // not video
      return NULL;

    if (!pBlock->IsKey())
      return NULL;

    return pEntry;
  }
}